

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckCommand(ScriptValidator *this,Command *command)

{
  Errors *pEVar1;
  initializer_list<wabt::Type> __l;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *p_Var2;
  ModuleCommand *pMVar3;
  ScriptModuleCommand *pSVar4;
  ActionCommandBase<(wabt::CommandType)2> *pAVar5;
  AssertReturnCommand *pAVar6;
  AssertTrapCommandBase<(wabt::CommandType)9> *pAVar7;
  AssertTrapCommandBase<(wabt::CommandType)10> *pAVar8;
  AssertExceptionCommand *pAVar9;
  pointer pAVar10;
  ActionResult AVar11;
  allocator<wabt::Type> local_5d1;
  Type local_5d0;
  iterator local_5c8;
  size_type local_5c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_5b8;
  pointer local_5a0;
  Expectation *expected;
  ActionResult result;
  Action *action;
  AssertReturnCommand *assert_return_command;
  undefined1 local_560 [8];
  Validator module_validator_1;
  undefined1 local_2b8 [8];
  Validator module_validator;
  Command *command_local;
  ScriptValidator *this_local;
  
  module_validator._664_8_ = command;
  switch(command->type) {
  case First:
    pEVar1 = this->errors_;
    pMVar3 = cast<wabt::ModuleCommand,wabt::Command>(command);
    Validator::Validator((Validator *)local_2b8,pEVar1,&pMVar3->module,this->options_);
    module_validator_1._668_4_ = Validator::CheckModule((Validator *)local_2b8);
    Validator::~Validator((Validator *)local_2b8);
    break;
  case ScriptModule:
    pEVar1 = this->errors_;
    pSVar4 = cast<wabt::ScriptModuleCommand,wabt::Command>(command);
    Validator::Validator((Validator *)local_560,pEVar1,&pSVar4->module,this->options_);
    Validator::CheckModule((Validator *)local_560);
    Validator::~Validator((Validator *)local_560);
    break;
  case Action:
    pAVar5 = cast<wabt::ActionCommandBase<(wabt::CommandType)2>,wabt::Command>(command);
    pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get
                        (&pAVar5->action);
    CheckAction(this,pAVar10);
    break;
  case Register:
  case AssertMalformed:
  case AssertInvalid:
  case AssertUnlinkable:
  case AssertUninstantiable:
    break;
  case AssertReturn:
    pAVar6 = cast<wabt::AssertReturnCommand,wabt::Command>(command);
    result.field_1.types =
         (TypeVector *)
         std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get(&pAVar6->action);
    AVar11 = CheckAction(this,(Action *)result.field_1.types);
    result._0_8_ = AVar11.field_1;
    expected._0_4_ = AVar11.kind;
    local_5a0 = std::unique_ptr<wabt::Expectation,_std::default_delete<wabt::Expectation>_>::get
                          (&pAVar6->expected);
    if ((Kind)expected != Error) {
      if ((Kind)expected == Types) {
        CheckExpectationTypes
                  (this,(Location *)
                        &((result.field_1.types)->
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(TypeVector *)result._0_8_,local_5a0,
                   "action");
      }
      else if ((Kind)expected == Type) {
        p_Var2 = &(result.field_1.types)->
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>;
        local_5d0.enum_ = result.kind;
        local_5d0.type_index_ = result._4_4_;
        local_5c8 = &local_5d0;
        local_5c0 = 1;
        std::allocator<wabt::Type>::allocator(&local_5d1);
        __l._M_len = local_5c0;
        __l._M_array = local_5c8;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_5b8,__l,&local_5d1);
        CheckExpectationTypes
                  (this,(Location *)&(p_Var2->_M_impl).super__Vector_impl_data._M_finish,&local_5b8,
                   local_5a0,"action");
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_5b8);
        std::allocator<wabt::Type>::~allocator(&local_5d1);
      }
    }
    break;
  case AssertTrap:
    pAVar7 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)9>,wabt::Command>(command);
    pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get
                        (&pAVar7->action);
    CheckAction(this,pAVar10);
    break;
  case AssertExhaustion:
    pAVar8 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>(command);
    pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get
                        (&pAVar8->action);
    CheckAction(this,pAVar10);
    break;
  case AssertException:
    pAVar9 = cast<wabt::AssertExceptionCommand,wabt::Command>(command);
    pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get
                        (&pAVar9->action);
    CheckAction(this,pAVar10);
  }
  return;
}

Assistant:

void ScriptValidator::CheckCommand(const Command* command) {
  switch (command->type) {
    case CommandType::Module: {
      Validator module_validator(errors_, &cast<ModuleCommand>(command)->module,
                                 options_);
      module_validator.CheckModule();
      break;
    }

    case CommandType::ScriptModule: {
      Validator module_validator(
          errors_, &cast<ScriptModuleCommand>(command)->module, options_);
      module_validator.CheckModule();
      break;
    }

    case CommandType::Action:
      // Ignore result type.
      CheckAction(cast<ActionCommand>(command)->action.get());
      break;

    case CommandType::Register:
    case CommandType::AssertMalformed:
    case CommandType::AssertInvalid:
    case CommandType::AssertUnlinkable:
    case CommandType::AssertUninstantiable:
      // Ignore.
      break;

    case CommandType::AssertReturn: {
      auto* assert_return_command = cast<AssertReturnCommand>(command);
      const Action* action = assert_return_command->action.get();
      ActionResult result = CheckAction(action);
      const Expectation* expected = assert_return_command->expected.get();
      switch (result.kind) {
        case ActionResult::Kind::Types:
          CheckExpectationTypes(&action->loc, *result.types, expected,
                                "action");
          break;

        case ActionResult::Kind::Type:
          CheckExpectationTypes(&action->loc, {result.type}, expected,
                                "action");
          break;

        case ActionResult::Kind::Error:
          // Error occurred, don't do any further checks.
          break;
      }
      break;
    }

    case CommandType::AssertTrap:
      // ignore result type.
      CheckAction(cast<AssertTrapCommand>(command)->action.get());
      break;
    case CommandType::AssertExhaustion:
      // ignore result type.
      CheckAction(cast<AssertExhaustionCommand>(command)->action.get());
      break;
    case CommandType::AssertException:
      // ignore result type.
      CheckAction(cast<AssertExceptionCommand>(command)->action.get());
      break;
  }
}